

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixfree_gmres.cpp
# Opt level: O3

void __thiscall MatrixFreeGMRES::MatrixFreeGMRES(MatrixFreeGMRES *this,int dim_equation,int k)

{
  undefined8 *puVar1;
  ulong uVar2;
  long size;
  ulong rows;
  
  this->_vptr_MatrixFreeGMRES = (_func_int **)&PTR___cxa_pure_virtual_00120bc8;
  (this->hessenberg_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_data = (double *)0x0;
  (this->hessenberg_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_rows = 0;
  (this->hessenberg_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_cols = 0;
  (this->basis_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->basis_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->basis_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->b_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->b_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->givens_c_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->givens_c_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->givens_s_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->givens_s_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->g_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->g_vec_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  this->dim_equation_ = dim_equation;
  this->max_dim_krylov_ = k;
  if (-2 < k) {
    uVar2 = (ulong)(k + 1);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->hessenberg_mat_,uVar2 * uVar2,uVar2,
               uVar2);
    rows = (ulong)this->dim_equation_;
    uVar2 = (long)this->max_dim_krylov_ + 1;
    if (-1 < (long)(uVar2 | rows)) {
      if (((this->dim_equation_ != 0) && ((int)uVar2 != 0)) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar2),0) <
          (long)rows)) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = std::ios::widen;
        __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->basis_mat_,uVar2 * rows,rows,uVar2);
      size = (long)this->dim_equation_;
      if (-1 < size) {
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)&this->b_vec_,size,size,1);
        if (-2 < this->max_dim_krylov_) {
          uVar2 = (ulong)(this->max_dim_krylov_ + 1);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<double,__1,__1,_1,_0> *)&this->givens_c_vec_,uVar2,uVar2,1);
          if (-2 < this->max_dim_krylov_) {
            uVar2 = (ulong)(this->max_dim_krylov_ + 1);
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<double,__1,__1,_1,_0> *)&this->givens_s_vec_,uVar2,uVar2,1);
            if (-2 < this->max_dim_krylov_) {
              uVar2 = (ulong)(this->max_dim_krylov_ + 1);
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                        ((DenseStorage<double,__1,__1,_1,_0> *)&this->g_vec_,uVar2,uVar2,1);
              return;
            }
          }
        }
      }
      __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

MatrixFreeGMRES::MatrixFreeGMRES(const int dim_equation, const int k)
{
    dim_equation_ = dim_equation;
    max_dim_krylov_ = k;

    // Allocate matrices and vectors for matrix-free GMRES.
    hessenberg_mat_.resize(max_dim_krylov_+1, max_dim_krylov_+1);
    basis_mat_.resize(dim_equation_, max_dim_krylov_+1);
    b_vec_.resize(dim_equation_);
    givens_c_vec_.resize(max_dim_krylov_+1);
    givens_s_vec_.resize(max_dim_krylov_+1);
    g_vec_.resize(max_dim_krylov_+1);
}